

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

void __thiscall
andres::View<int,true,std::allocator<unsigned_long>>::
permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
          (View<int,true,std::allocator<unsigned_long>> *this,
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          begin)

{
  long lVar1;
  undefined8 *puVar2;
  bool bVar3;
  runtime_error *prVar4;
  View<int,true,std::allocator<unsigned_long>> VVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __v;
  vector<unsigned_long,_std::allocator<unsigned_long>_> newStrides;
  vector<unsigned_long,_std::allocator<unsigned_long>_> newShape;
  unsigned_long local_98;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_90;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_60;
  
  View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)this);
  if (*(long *)this == 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Assertion failed.");
  }
  else if (*(long *)(this + 0x28) == 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Assertion failed.");
  }
  else {
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_90._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_90._M_impl.super__Rb_tree_header._M_header;
    local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_98 = 0;
    __v._M_current = begin._M_current;
    local_90._M_impl.super__Rb_tree_header._M_header._M_right =
         local_90._M_impl.super__Rb_tree_header._M_header._M_left;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    while (local_98 < *(ulong *)(this + 0x28)) {
      std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::_M_insert_unique<unsigned_long_const&>
                ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                  *)&local_60,&local_98);
      std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::_M_insert_unique<unsigned_long_const&>
                ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                  *)&local_90,__v._M_current);
      __v._M_current = __v._M_current + 1;
      local_98 = local_98 + 1;
      if (*(long *)this == 0) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,"Assertion failed.");
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    if ((local_60._M_impl.super__Rb_tree_header._M_node_count !=
         local_90._M_impl.super__Rb_tree_header._M_node_count) ||
       (bVar3 = std::__equal<false>::
                equal<std::_Rb_tree_const_iterator<unsigned_long>,std::_Rb_tree_const_iterator<unsigned_long>>
                          ((_Rb_tree_const_iterator<unsigned_long>)
                           local_60._M_impl.super__Rb_tree_header._M_header._M_left,
                           (_Rb_tree_const_iterator<unsigned_long>)
                           &local_60._M_impl.super__Rb_tree_header,
                           (_Rb_tree_const_iterator<unsigned_long>)
                           local_90._M_impl.super__Rb_tree_header._M_header._M_left), !bVar3)) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"Assertion failed.");
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~_Rb_tree(&local_90);
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~_Rb_tree(&local_60);
    if (*(long *)this != 0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_60,
                 *(size_type *)(this + 0x28),(allocator_type *)&local_90);
      if (*(long *)this == 0) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,"Assertion failed.");
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_90,
                 *(size_type *)(this + 0x28),(allocator_type *)&local_98);
      if (*(long *)this == 0) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,"Assertion failed.");
LAB_00230d43:
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar6 = *(ulong *)(this + 0x28);
      if (uVar6 != 0) {
        lVar8 = *(long *)(this + 0x10);
        lVar1 = *(long *)(this + 0x20);
        uVar9 = 0;
        do {
          if (uVar6 <= begin._M_current[uVar9]) {
            prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar4,"Assertion failed.");
            goto LAB_00230d43;
          }
          *(undefined8 *)(local_60._M_impl._0_8_ + uVar9 * 8) =
               *(undefined8 *)(lVar8 + begin._M_current[uVar9] * 8);
          if (*(ulong *)(this + 0x28) <= begin._M_current[uVar9]) {
            prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar4,"Assertion failed.");
            goto LAB_00230d43;
          }
          *(undefined8 *)(local_90._M_impl._0_8_ + uVar9 * 8) =
               *(undefined8 *)(lVar1 + begin._M_current[uVar9] * 8);
          uVar9 = uVar9 + 1;
          uVar6 = *(ulong *)(this + 0x28);
        } while (uVar9 < uVar6);
      }
      if (uVar6 != 0) {
        lVar8 = *(long *)(this + 0x10);
        lVar1 = *(long *)(this + 0x20);
        uVar9 = 0;
        do {
          if (uVar6 <= uVar9) {
            prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar4,"Assertion failed.");
LAB_00230cf3:
            __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          *(undefined8 *)(lVar8 + uVar9 * 8) = *(undefined8 *)(local_60._M_impl._0_8_ + uVar9 * 8);
          if (*(ulong *)(this + 0x28) <= uVar9) {
            prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar4,"Assertion failed.");
            goto LAB_00230cf3;
          }
          *(undefined8 *)(lVar1 + uVar9 * 8) = *(undefined8 *)(local_90._M_impl._0_8_ + uVar9 * 8);
          uVar9 = uVar9 + 1;
          uVar6 = *(ulong *)(this + 0x28);
        } while (uVar9 < uVar6);
        if (uVar6 != 0) {
          puVar2 = *(undefined8 **)(this + 0x18);
          if (*(int *)(this + 0x38) == 0) {
            puVar2[uVar6 - 1] = 1;
            if (uVar6 != 1) {
              lVar7 = 1;
              do {
                lVar7 = lVar7 * *(long *)(lVar8 + -8 + uVar6 * 8);
                puVar2[uVar6 - 2] = lVar7;
                uVar6 = uVar6 - 1;
              } while (uVar6 != 1);
            }
          }
          else {
            *puVar2 = 1;
            if (uVar6 != 1) {
              lVar7 = 1;
              lVar10 = 0;
              do {
                lVar7 = lVar7 * *(long *)(lVar8 + lVar10 * 8);
                puVar2[lVar10 + 1] = lVar7;
                lVar10 = lVar10 + 1;
              } while (uVar6 - 1 != lVar10);
            }
          }
          VVar5 = (View<int,true,std::allocator<unsigned_long>>)0x1;
          if (*(long *)(this + 0x28) != 0) {
            lVar8 = 0;
            do {
              if (puVar2[lVar8] != *(long *)(lVar1 + lVar8 * 8)) {
                VVar5 = (View<int,true,std::allocator<unsigned_long>>)0x0;
                break;
              }
              lVar8 = lVar8 + 1;
            } while (*(long *)(this + 0x28) != lVar8);
          }
          this[0x3c] = VVar5;
          View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)this);
          if ((void *)local_90._M_impl._0_8_ != (void *)0x0) {
            operator_delete((void *)local_90._M_impl._0_8_,
                            (long)local_90._M_impl.super__Rb_tree_header._M_header._M_parent -
                            local_90._M_impl._0_8_);
          }
          if ((void *)local_60._M_impl._0_8_ != (void *)0x0) {
            operator_delete((void *)local_60._M_impl._0_8_,
                            (long)local_60._M_impl.super__Rb_tree_header._M_header._M_parent -
                            local_60._M_impl._0_8_);
          }
          return;
        }
      }
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"Assertion failed.");
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Assertion failed.");
  }
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
View<T, isConst, A>::permute
(
    CoordinateIterator begin
)
{
    testInvariant();
    if(!MARRAY_NO_ARG_TEST) {
        marray_detail::Assert(dimension() != 0);
        std::set<std::size_t> s1, s2;
        CoordinateIterator it = begin;
        for(std::size_t j=0; j<dimension(); ++j) {
            s1.insert(j);
            s2.insert(*it);
            ++it;
        }
        marray_detail::Assert(s1 == s2);
    }
    // update shape, shape strides, strides, and simplicity
    std::vector<std::size_t> newShape = std::vector<std::size_t>(dimension());
    std::vector<std::size_t> newStrides = std::vector<std::size_t>(dimension());
    for(std::size_t j=0; j<dimension(); ++j) {
        newShape[j] = geometry_.shape(static_cast<std::size_t>(*begin));
        newStrides[j] = geometry_.strides(static_cast<std::size_t>(*begin));
        ++begin;
    }
    for(std::size_t j=0; j<dimension(); ++j) {
        geometry_.shape(j) = newShape[j];
        geometry_.strides(j) = newStrides[j];
    }
    marray_detail::stridesFromShape(geometry_.shapeBegin(), geometry_.shapeEnd(),
        geometry_.shapeStridesBegin(), geometry_.coordinateOrder());
    updateSimplicity();
    testInvariant();
}